

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.hpp
# Opt level: O2

void __thiscall CaDiCaL::Internal::mark_ternary(Internal *this,int lit)

{
  int64_t *piVar1;
  undefined1 *puVar2;
  pointer pFVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)-lit;
  if (0 < lit) {
    uVar4 = (ulong)(uint)lit;
  }
  pFVar3 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pFVar3[uVar4].field_0x1 & 4) == 0) {
    piVar1 = &(this->stats).mark.ternary;
    *piVar1 = *piVar1 + 1;
    puVar2 = &pFVar3[uVar4].field_0x1;
    *puVar2 = *puVar2 | 4;
  }
  return;
}

Assistant:

int vidx (int lit) const {
    int idx;
    assert (lit);
    assert (lit != INT_MIN);
    idx = abs (lit);
    assert (idx <= max_var);
    return idx;
  }